

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::NewCovergroupExpression::fromSyntax
          (Compilation *compilation,NewClassExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  char *pcVar1;
  ArgumentListSyntax *argSyntax;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  NewCovergroupExpression *pNVar4;
  EVP_PKEY_CTX *src;
  Type *pTVar5;
  string_view symbolName;
  SourceRange range;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  SourceRange local_90;
  SmallVectorBase<const_slang::ast::Expression_*> local_80 [2];
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_40;
  
  local_90 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pTVar5 = assignmentTarget->canonical;
  if (pTVar5 == (Type *)0x0) {
    Type::resolveCanonical(assignmentTarget);
    pTVar5 = assignmentTarget->canonical;
  }
  pcVar1 = local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 5;
  argSyntax = syntax->argList;
  local_80[0].data_ = (pointer)pcVar1;
  if (*(int *)&pTVar5[1].super_Symbol.nextInScope != 0) {
    Scope::elaborate((Scope *)(pTVar5 + 1));
  }
  symbolName._M_str = "new";
  symbolName._M_len = 3;
  bVar2 = CallExpression::bindArgs
                    (argSyntax,
                     *(span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *
                      )&pTVar5[1].canonical,symbolName,local_90,context,local_80,false);
  if (bVar2) {
    iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_80,(EVP_PKEY_CTX *)compilation,src);
    local_40._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
    pNVar4 = BumpAllocator::
             emplace<slang::ast::NewCovergroupExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                       (&compilation->super_BumpAllocator,assignmentTarget,&local_40,&local_90);
  }
  else {
    pNVar4 = (NewCovergroupExpression *)Expression::badExpr(compilation,(Expression *)0x0);
  }
  if (local_80[0].data_ != (pointer)pcVar1) {
    operator_delete(local_80[0].data_);
  }
  return &pNVar4->super_Expression;
}

Assistant:

Expression& NewCovergroupExpression::fromSyntax(Compilation& compilation,
                                                const NewClassExpressionSyntax& syntax,
                                                const ASTContext& context,
                                                const Type& assignmentTarget) {
    auto range = syntax.sourceRange();
    auto& coverType = assignmentTarget.getCanonicalType().as<CovergroupType>();

    SmallVector<const Expression*> args;
    if (!CallExpression::bindArgs(syntax.argList, coverType.getArguments(), "new"sv, range, context,
                                  args, /* isBuiltInMethod */ false)) {
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<NewCovergroupExpression>(assignmentTarget, args.copy(compilation),
                                                         range);
}